

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O0

object_t * __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::pop
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this)

{
  object_t *result;
  lock_guard<acto::intrusive::spin_lock> g;
  queue<acto::core::object_t,_acto::intrusive::spin_lock> *this_local;
  
  g._M_device = (mutex_type *)this;
  std::lock_guard<acto::intrusive::spin_lock>::lock_guard
            ((lock_guard<acto::intrusive::spin_lock> *)&result,&this->mutex_);
  if (this->tail_ == (object_t *)0x0) {
    this_local = (queue<acto::core::object_t,_acto::intrusive::spin_lock> *)0x0;
  }
  else {
    this_local = (queue<acto::core::object_t,_acto::intrusive::spin_lock> *)
                 (this->tail_->super_node<acto::core::object_t>).next;
    if ((object_t *)this_local == this->tail_) {
      this->tail_ = (object_t *)0x0;
    }
    else {
      (this->tail_->super_node<acto::core::object_t>).next =
           (((this->tail_->super_node<acto::core::object_t>).next)->super_node<acto::core::object_t>
           ).next;
    }
    (((object_t *)this_local)->super_node<acto::core::object_t>).next = (object_t *)0x0;
  }
  std::lock_guard<acto::intrusive::spin_lock>::~lock_guard
            ((lock_guard<acto::intrusive::spin_lock> *)&result);
  return (object_t *)this_local;
}

Assistant:

T* pop() {
    std::lock_guard g(mutex_);

    if (tail_) {
      T* result = tail_->next;

      if (result == tail_)
        tail_ = nullptr;
      else
        tail_->next = tail_->next->next;

      result->next = nullptr;
      return result;
    }
    return nullptr;
  }